

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

faidx_t * fai_read(FILE *fp)

{
  int iVar1;
  kh_s_t *pkVar2;
  char *pcVar3;
  ushort **ppuVar4;
  bool bVar5;
  uint64_t local_40;
  longlong offset;
  int local_30;
  int line_blen;
  int line_len;
  int len;
  char *p;
  char *buf;
  faidx_t *fai;
  FILE *fp_local;
  
  fai = (faidx_t *)fp;
  buf = (char *)calloc(1,0x20);
  pkVar2 = kh_init_s();
  *(kh_s_t **)(buf + 0x18) = pkVar2;
  p = (char *)calloc(0x10000,1);
  while( true ) {
    iVar1 = feof((FILE *)fai);
    bVar5 = false;
    if (iVar1 == 0) {
      pcVar3 = fgets(p,0x10000,(FILE *)fai);
      bVar5 = pcVar3 != (char *)0x0;
    }
    if (!bVar5) break;
    _line_len = p;
    while( true ) {
      bVar5 = false;
      if (*_line_len != '\0') {
        ppuVar4 = __ctype_b_loc();
        bVar5 = ((*ppuVar4)[(int)*_line_len] & 0x8000) != 0;
      }
      if (!bVar5) break;
      _line_len = _line_len + 1;
    }
    *_line_len = '\0';
    _line_len = _line_len + 1;
    __isoc99_sscanf(_line_len,"%d%lld%d%d",&line_blen,&local_40,(long)&offset + 4,&local_30);
    fai_insert_index((faidx_t *)buf,p,line_blen,local_30,offset._4_4_,local_40);
  }
  free(p);
  return (faidx_t *)buf;
}

Assistant:

faidx_t *fai_read(FILE *fp)
{
    faidx_t *fai;
    char *buf, *p;
    int len, line_len, line_blen;
#ifdef _WIN32
    long offset;
#else
    long long offset;
#endif
    fai = (faidx_t*)calloc(1, sizeof(faidx_t));
    fai->hash = kh_init(s);
    buf = (char*)calloc(0x10000, 1);
    while (!feof(fp) && fgets(buf, 0x10000, fp)) {
        for (p = buf; *p && isgraph(*p); ++p);
        *p = 0; ++p;
#ifdef _WIN32
        sscanf(p, "%d%ld%d%d", &len, &offset, &line_blen, &line_len);
#else
        sscanf(p, "%d%lld%d%d", &len, &offset, &line_blen, &line_len);
#endif
        fai_insert_index(fai, buf, len, line_len, line_blen, offset);
    }
    free(buf);
    return fai;
}